

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void DumpStateHelper(FStateLabels *StateList,FString *prefix)

{
  FState *state;
  FStateLabels *StateList_00;
  PClassActor *pPVar1;
  FStateLabel *pFVar2;
  long lVar3;
  FString FStack_48;
  FStateLabels *local_40;
  FString local_38;
  
  pFVar2 = StateList->Labels;
  local_40 = StateList;
  for (lVar3 = 0; lVar3 < local_40->NumLabels; lVar3 = lVar3 + 1) {
    state = pFVar2->State;
    if (state != (FState *)0x0) {
      pPVar1 = FState::StaticFindStateOwner(state);
      if (pPVar1 == (PClassActor *)0x0) {
        Printf(5,"%s%s: invalid\n",prefix->Chars,
               FName::NameData.NameArray[(pFVar2->Label).Index].Text);
      }
      else {
        Printf(5,"%s%s: %s.%d\n",prefix->Chars,FName::NameData.NameArray[(pFVar2->Label).Index].Text
               ,FName::NameData.NameArray
                [(pPVar1->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
               ((long)state - (long)pPVar1->OwnedStates) / 0x28 & 0xffffffff);
      }
    }
    StateList_00 = pFVar2->Children;
    if (StateList_00 != (FStateLabels *)0x0) {
      FString::operator+(&FStack_48,(char)prefix);
      FString::operator+(&local_38,(char *)&FStack_48);
      DumpStateHelper(StateList_00,&local_38);
      FString::~FString(&local_38);
      FString::~FString(&FStack_48);
    }
    pFVar2 = pFVar2 + 1;
  }
  return;
}

Assistant:

void DumpStateHelper(FStateLabels *StateList, const FString &prefix)
{
	for (int i = 0; i < StateList->NumLabels; i++)
	{
		if (StateList->Labels[i].State != NULL)
		{
			const PClassActor *owner = FState::StaticFindStateOwner(StateList->Labels[i].State);
			if (owner == NULL)
			{
				Printf(PRINT_LOG, "%s%s: invalid\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars());
			}
			else
			{
				Printf(PRINT_LOG, "%s%s: %s.%d\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars(),
					owner->TypeName.GetChars(), int(StateList->Labels[i].State - owner->OwnedStates));
			}
		}
		if (StateList->Labels[i].Children != NULL)
		{
			DumpStateHelper(StateList->Labels[i].Children, prefix + '.' + StateList->Labels[i].Label.GetChars());
		}
	}
}